

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O3

bool llvm::DWARFDebugLoclists::dumpLocationList
               (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,raw_ostream *OS,
               uint64_t BaseAddr,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent
               )

{
  undefined4 uVar1;
  raw_ostream *this;
  undefined6 in_register_00000012;
  Error *E_00;
  MCRegisterInfo *pMVar2;
  ulong uVar3;
  bool bVar4;
  StringRef SVar5;
  StringRef SVar6;
  function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F;
  undefined1 local_a0 [32];
  DWARFUnit **local_80;
  DIDumpOptions *local_78;
  uint *local_70;
  MCRegisterInfo **local_68;
  uint64_t local_60;
  uint64_t BaseAddr_local;
  MCRegisterInfo *MRI_local;
  ulong local_48;
  uint local_3c;
  char *local_38;
  Error E;
  
  uVar1 = DumpOpts._20_4_;
  uVar3 = CONCAT62(in_register_00000012,Version) & 0xffffffff;
  MRI_local = (MCRegisterInfo *)0x0;
  bVar4 = DumpOpts.Verbose == true;
  DumpOpts._20_4_ = uVar1;
  local_60 = BaseAddr;
  BaseAddr_local = (uint64_t)MRI;
  if (bVar4) {
    SVar5 = dwarf::LocListEncodingString(0);
    SVar6 = dwarf::LocListEncodingString(1);
    local_3c = (uint)CONCAT62(in_register_00000012,Version);
    pMVar2 = (MCRegisterInfo *)SVar6.Length;
    if ((MCRegisterInfo *)SVar6.Length < (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(2);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(3);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(4);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(5);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(6);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(7);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(8);
    MRI_local = pMVar2;
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      MRI_local = (MCRegisterInfo *)SVar5.Length;
    }
    uVar3 = (ulong)local_3c;
  }
  local_a0._8_8_ = "0x%8.8lx: ";
  local_a0._0_8_ = &PTR_home_00d77818;
  local_a0._16_8_ = *Offset;
  raw_ostream::operator<<(OS,(format_object_base *)local_a0);
  local_a0._8_8_ = &local_60;
  local_a0._24_8_ = &BaseAddr_local;
  local_80 = &U;
  local_78 = &DumpOpts;
  local_70 = &Indent;
  local_68 = &MRI_local;
  F.callback = (_func_bool_intptr_t_Entry_ptr *)(uVar3 & 0xffff);
  F.callable = (intptr_t)
               function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
               callback_fn<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
  ;
  local_a0._0_8_ = OS;
  local_a0._16_8_ = Data;
  visitLocationList((DWARFDataExtractor *)&local_38,(uint64_t *)Data,(uint16_t)Offset,F);
  uVar3 = (ulong)local_38 & 0xfffffffffffffffe;
  local_38 = (char *)(uVar3 != 0 | uVar3);
  if (uVar3 != 0) {
    SVar5.Length = 1;
    SVar5.Data = "\n";
    raw_ostream::operator<<(OS,SVar5);
    raw_ostream::indent(OS,Indent);
    SVar6.Length = 7;
    SVar6.Data = "error: ";
    this = raw_ostream::operator<<(OS,SVar6);
    local_48 = (ulong)local_38 | 1;
    local_38 = (char *)0x0;
    toString_abi_cxx11_((string *)local_a0,(llvm *)&local_48,E_00);
    raw_ostream::write(this,(int)local_a0._0_8_,(void *)local_a0._8_8_,(size_t)F.callback);
    if ((raw_ostream *)local_a0._0_8_ != (raw_ostream *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
    }
    if ((long *)(local_48 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_48 & 0xfffffffffffffffe) + 8))();
    }
  }
  if ((long *)((ulong)local_38 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38 & 0xfffffffffffffffe) + 8))();
  }
  return uVar3 == 0;
}

Assistant:

bool DWARFDebugLoclists::dumpLocationList(const DWARFDataExtractor &Data,
                                          uint64_t *Offset, uint16_t Version,
                                          raw_ostream &OS, uint64_t BaseAddr,
                                          const MCRegisterInfo *MRI,
                                          DWARFUnit *U, DIDumpOptions DumpOpts,
                                          unsigned Indent) {
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
#define HANDLE_DW_LLE(ID, NAME)                                                \
  MaxEncodingStringLength = std::max(MaxEncodingStringLength,                  \
                                     dwarf::LocListEncodingString(ID).size());
#include "llvm/BinaryFormat/Dwarf.def"
  }

  OS << format("0x%8.8" PRIx64 ": ", *Offset);
  Error E = visitLocationList(Data, Offset, Version, [&](const Entry &E) {
    E.dump(OS, BaseAddr, Data.isLittleEndian(), Data.getAddressSize(), MRI, U,
           DumpOpts, Indent, MaxEncodingStringLength);
    return true;
  });
  if (E) {
    OS << "\n";
    OS.indent(Indent);
    OS << "error: " << toString(std::move(E));
    return false;
  }
  return true;
}